

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O0

void __thiscall
Atari2600::TIA::draw_object<Atari2600::TIA::Ball>
          (TIA *this,Ball *object,uint8_t collision_identity,int start,int end)

{
  uint8_t collision_identity_00;
  Ball *pBVar1;
  int iVar2;
  int *piVar3;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int first_pixel;
  int end_local;
  int start_local;
  uint8_t collision_identity_local;
  Ball *object_local;
  TIA *this_local;
  
  local_28 = 0;
  if ((this->horizontal_blank_extend_ & 1U) != 0) {
    local_28 = 8;
  }
  local_28 = local_28 + 0x40;
  local_24 = end;
  first_pixel = start;
  end_local._3_1_ = collision_identity;
  _start_local = object;
  object_local = (Ball *)this;
  HorizontalRun::dequeue_pixels
            (&object->super_HorizontalRun,this->collision_buffer_,collision_identity,end + -0x44);
  pBVar1 = _start_local;
  iVar2 = first_pixel;
  if (first_pixel < local_28) {
    piVar3 = std::min<int>(&local_24,&local_28);
    perform_border_motion<Atari2600::TIA::Ball>(this,pBVar1,iVar2,*piVar3);
  }
  pBVar1 = _start_local;
  collision_identity_00 = end_local._3_1_;
  if (local_28 <= local_24) {
    if (first_pixel < local_28) {
      first_pixel = local_28;
    }
    if (first_pixel < local_24) {
      if (first_pixel < 0xe0) {
        iVar2 = first_pixel + -0x40;
        local_2c = local_24 + -0x40;
        local_30 = 0xa0;
        piVar3 = std::min<int>(&local_2c,&local_30);
        draw_object_visible<Atari2600::TIA::Ball>
                  (this,pBVar1,collision_identity_00,iVar2,*piVar3,local_24 + -0x44);
      }
      if (((((_start_local->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.
             is_moving & 1U) != 0) && (0xdf < local_24)) &&
         ((_start_local->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.
          motion_time < local_24)) {
        perform_motion_step<Atari2600::TIA::Ball>(this,_start_local);
      }
    }
  }
  return;
}

Assistant:

void TIA::draw_object(T &object, const uint8_t collision_identity, int start, int end) {
	int first_pixel = first_pixel_cycle - 4 + (horizontal_blank_extend_ ? 8 : 0);

	object.dequeue_pixels(collision_buffer_, collision_identity, end - first_pixel_cycle);

	// movement works across the entire screen, so do work that falls outside of the pixel area
	if(start < first_pixel) {
		perform_border_motion<T>(object, start, std::min(end, first_pixel));
	}

	// don't continue to do any drawing if this window ends too early
	if(end < first_pixel) return;
	if(start < first_pixel) start = first_pixel;
	if(start >= end) return;

	// perform the visible part of the line, if any
	if(start < 224) {
		draw_object_visible<T>(object, collision_identity, start - first_pixel_cycle + 4, std::min(end - first_pixel_cycle + 4, 160), end - first_pixel_cycle);
	}

	// move further if required
	if(object.is_moving && end >= 224 && object.motion_time < end) {
		perform_motion_step<T>(object);
	}
}